

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BiasLayerParams::BiasLayerParams(BiasLayerParams *this,BiasLayerParams *from)

{
  int new_size;
  void *pvVar1;
  WeightParams *from_00;
  WeightParams *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__BiasLayerParams_003d4530;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->shape_).current_size_ = 0;
  (this->shape_).total_size_ = 0;
  (this->shape_).rep_ = (Rep *)0x0;
  new_size = (from->shape_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->shape_,new_size);
    memcpy(((this->shape_).rep_)->elements,((from->shape_).rep_)->elements,
           (long)(from->shape_).current_size_ << 3);
    (this->shape_).current_size_ = (from->shape_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->bias_;
  if (from_00 == (WeightParams *)0x0 ||
      from == (BiasLayerParams *)&_BiasLayerParams_default_instance_) {
    this_00 = (WeightParams *)0x0;
  }
  else {
    this_00 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(this_00,from_00);
  }
  this->bias_ = this_00;
  return;
}

Assistant:

BiasLayerParams::BiasLayerParams(const BiasLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      shape_(from.shape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BiasLayerParams)
}